

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_in_struct
          (CompilerHLSL *this,SPIRVariable *var,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  uint uVar1;
  ExecutionModel EVar2;
  StorageClass SVar3;
  bool bVar4;
  BaseType BVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  SPIREntryPoint *pSVar9;
  SPIRType *pSVar10;
  BaseType *pBVar11;
  Bitset *pBVar12;
  size_type sVar13;
  CompilerError *pCVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  bool bVar16;
  uint local_3ec;
  SPIREntryPoint *local_3e8;
  SPIRVariable *local_3e0;
  string effective_semantic;
  string local_3b0;
  string name;
  string semantic;
  string binding;
  SPIRType newtype;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  SPIRType type;
  
  pSVar9 = Compiler::get_entry_point((Compiler *)this);
  pSVar10 = Compiler::get<spirv_cross::SPIRType>
                      ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar10);
  binding._M_dataplus._M_p = (pointer)&binding.field_2;
  binding._M_string_length = 0;
  binding.field_2._M_local_buf[0] = '\0';
  uVar1 = (this->hlsl_options).shader_model;
  EVar2 = pSVar9->model;
  SVar3 = var->storage;
  bVar6 = SVar3 != Output;
  bVar4 = EVar2 != ExecutionModelFragment;
  local_3e8 = pSVar9;
  if (SVar3 == Output && EVar2 == ExecutionModelFragment) {
    uVar7 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationIndex);
    uVar8 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (uVar8 != 0 && uVar7 != 0) {
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar14,"Dual-source blending is only supported on MRT #0 in HLSL.");
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar15 = "COLOR";
    if (0x1e < uVar1) {
      pcVar15 = "SV_Target";
    }
    semantic._M_dataplus._M_p._0_4_ = uVar8 + uVar7;
    name._M_dataplus._M_p = pcVar15;
    join<char_const*,unsigned_int>
              ((string *)&newtype,(spirv_cross *)&name,(char **)&semantic,(uint *)"SV_Target");
    ::std::__cxx11::string::operator=((string *)&binding,(string *)&newtype);
    ::std::__cxx11::string::~string((string *)&newtype);
    if (0x1e < uVar1) {
      bVar16 = false;
      goto LAB_001ad75c;
    }
    pBVar11 = &type.vecsize;
    BVar5 = UByte;
  }
  else {
    bVar16 = EVar2 == ExecutionModelVertex && SVar3 == Input;
    if ((EVar2 != ExecutionModelVertex || SVar3 != Input) || 0x1e < uVar1) goto LAB_001ad75c;
    pBVar11 = &type.basetype;
    BVar5 = Float;
  }
  *pBVar11 = BVar5;
  bVar16 = bVar6 || bVar4;
LAB_001ad75c:
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&name,this,(ulong)(var->super_IVariant).self.id,1);
  if (bVar6 || bVar4) {
    bVar6 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    if (bVar6) {
      uVar7 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    }
    else {
      newtype.super_IVariant._vptr_IVariant._0_4_ = 0;
      while( true ) {
        if (0x3f < (uint)newtype.super_IVariant._vptr_IVariant) {
          pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar14,"All locations from 0 to 63 are exhausted.");
          __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&active_locations->_M_h,(key_type *)&newtype);
        uVar7 = (uint)newtype.super_IVariant._vptr_IVariant;
        if (sVar13 == 0) break;
        newtype.super_IVariant._vptr_IVariant._0_4_ =
             (uint)newtype.super_IVariant._vptr_IVariant + 1;
      }
    }
    ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
    to_semantic_abi_cxx11_(&semantic,this,uVar7,local_3e8->model,var->storage);
    if ((bool)(bVar16 & 1 < type.columns)) {
      local_3e0 = var;
      if (type.array.super_VectorView<unsigned_int>.buffer_size != 0) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar14,"Arrays of matrices used as input/output. This is not supported.");
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      for (local_3ec = 0; local_3ec < type.columns; local_3ec = local_3ec + 1) {
        SPIRType::SPIRType(&newtype,&type);
        effective_semantic._M_dataplus._M_p = (pointer)&effective_semantic.field_2;
        effective_semantic._M_string_length = 0;
        newtype.columns = 1;
        effective_semantic.field_2._M_local_buf[0] = '\0';
        if ((this->hlsl_options).flatten_matrix_vertex_input_semantics == true) {
          ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)local_3e0->storage;
          to_semantic_abi_cxx11_(&local_3b0,this,uVar7,local_3e8->model,local_3e0->storage);
        }
        else {
          join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                    (&local_3b0,(spirv_cross *)&semantic,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330c68,
                     (char (*) [2])&local_3ec,(uint *)ts_2);
        }
        ::std::__cxx11::string::operator=((string *)&effective_semantic,(string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3b0);
        pBVar12 = Compiler::get_decoration_bitset
                            ((Compiler *)this,(ID)(local_3e0->super_IVariant).self.id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])(&local_3b0,this,pBVar12);
        join<std::__cxx11::string&,char_const(&)[2],unsigned_int&>
                  (&local_1d0,(spirv_cross *)&name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x330c68,
                   (char (*) [2])&local_3ec,(uint *)ts_2);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_1b0,this,&newtype,&local_1d0,0);
        ts_2 = &effective_semantic;
        CompilerGLSL::
        statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_3b0,&local_1b0,(char (*) [4])0x354db8,
                   &effective_semantic,(char (*) [2])0x344fd0);
        ::std::__cxx11::string::~string((string *)&local_1b0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        ::std::__cxx11::string::~string((string *)&local_3b0);
        local_3b0._M_dataplus._M_p._0_4_ = uVar7;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)active_locations,(value_type *)&local_3b0);
        uVar7 = uVar7 + 1;
        ::std::__cxx11::string::~string((string *)&effective_semantic);
        SPIRType::~SPIRType(&newtype);
      }
    }
    else {
      SPIRType::SPIRType(&newtype,&type);
      if ((local_3e8->model == ExecutionModelMeshEXT) ||
         (bVar6 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                             DecorationPerVertexKHR), bVar6)) {
        if (newtype.array.super_VectorView<unsigned_int>.buffer_size == 1) {
          newtype.array.super_VectorView<unsigned_int>.buffer_size = 0;
        }
        else {
          memmove(newtype.array.super_VectorView<unsigned_int>.ptr,
                  newtype.array.super_VectorView<unsigned_int>.ptr + 1,
                  newtype.array.super_VectorView<unsigned_int>.buffer_size * 4 - 4);
          newtype.array.super_VectorView<unsigned_int>.buffer_size =
               newtype.array.super_VectorView<unsigned_int>.buffer_size - 1;
        }
        if (newtype.array_size_literal.super_VectorView<bool>.buffer_size == 1) {
          newtype.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        }
        else {
          memmove(newtype.array_size_literal.super_VectorView<bool>.ptr,
                  newtype.array_size_literal.super_VectorView<bool>.ptr + 1,
                  newtype.array_size_literal.super_VectorView<bool>.buffer_size - 1);
          newtype.array_size_literal.super_VectorView<bool>.buffer_size =
               newtype.array_size_literal.super_VectorView<bool>.buffer_size - 1;
        }
      }
      pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(var->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])
                (&effective_semantic,this,pBVar12);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (&local_3b0,this,&newtype,&name,0);
      CompilerGLSL::
      statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&effective_semantic,&local_3b0,(char (*) [4])0x354db8,
                 &semantic,(char (*) [2])0x344fd0);
      ::std::__cxx11::string::~string((string *)&local_3b0);
      ::std::__cxx11::string::~string((string *)&effective_semantic);
      uVar8 = type_to_consumed_locations(this,&newtype);
      while (bVar6 = uVar8 != 0, uVar8 = uVar8 - 1, bVar6) {
        effective_semantic._M_dataplus._M_p._0_4_ = uVar7;
        ::std::__detail::
        _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)active_locations,(value_type *)&effective_semantic);
        uVar7 = uVar7 + 1;
      }
      SPIRType::~SPIRType(&newtype);
    }
    pSVar10 = (SPIRType *)&semantic;
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&newtype,this,&type,&name,0);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newtype,
               (char (*) [4])0x354db8,&binding,(char (*) [2])0x344fd0);
    pSVar10 = &newtype;
  }
  ::std::__cxx11::string::~string((string *)pSVar10);
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&binding);
  SPIRType::~SPIRType(&type);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_in_struct(const SPIRVariable &var, unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);

	string binding;
	bool use_location_number = true;
	bool need_matrix_unroll = false;
	bool legacy = hlsl_options.shader_model <= 30;
	if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
	{
		// Dual-source blending is achieved in HLSL by emitting to SV_Target0 and 1.
		uint32_t index = get_decoration(var.self, DecorationIndex);
		uint32_t location = get_decoration(var.self, DecorationLocation);

		if (index != 0 && location != 0)
			SPIRV_CROSS_THROW("Dual-source blending is only supported on MRT #0 in HLSL.");

		binding = join(legacy ? "COLOR" : "SV_Target", location + index);
		use_location_number = false;
		if (legacy) // COLOR must be a four-component vector on legacy shader model targets (HLSL ERR_COLOR_4COMP)
			type.vecsize = 4;
	}
	else if (var.storage == StorageClassInput && execution.model == ExecutionModelVertex)
	{
		need_matrix_unroll = true;
		if (legacy) // Inputs must be floating-point in legacy targets.
			type.basetype = SPIRType::Float;
	}

	const auto get_vacant_location = [&]() -> uint32_t {
		for (uint32_t i = 0; i < 64; i++)
			if (!active_locations.count(i))
				return i;
		SPIRV_CROSS_THROW("All locations from 0 to 63 are exhausted.");
	};

	auto name = to_name(var.self);
	if (use_location_number)
	{
		uint32_t location_number;

		// If an explicit location exists, use it with TEXCOORD[N] semantic.
		// Otherwise, pick a vacant location.
		if (has_decoration(var.self, DecorationLocation))
			location_number = get_decoration(var.self, DecorationLocation);
		else
			location_number = get_vacant_location();

		// Allow semantic remap if specified.
		auto semantic = to_semantic(location_number, execution.model, var.storage);

		if (need_matrix_unroll && type.columns > 1)
		{
			if (!type.array.empty())
				SPIRV_CROSS_THROW("Arrays of matrices used as input/output. This is not supported.");

			// Unroll matrices.
			for (uint32_t i = 0; i < type.columns; i++)
			{
				SPIRType newtype = type;
				newtype.columns = 1;

				string effective_semantic;
				if (hlsl_options.flatten_matrix_vertex_input_semantics)
					effective_semantic = to_semantic(location_number, execution.model, var.storage);
				else
					effective_semantic = join(semantic, "_", i);

				statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)),
				          variable_decl(newtype, join(name, "_", i)), " : ", effective_semantic, ";");
				active_locations.insert(location_number++);
			}
		}
		else
		{
			auto decl_type = type;
			if (execution.model == ExecutionModelMeshEXT || has_decoration(var.self, DecorationPerVertexKHR))
			{
				decl_type.array.erase(decl_type.array.begin());
				decl_type.array_size_literal.erase(decl_type.array_size_literal.begin());
			}
			statement(to_interpolation_qualifiers(get_decoration_bitset(var.self)), variable_decl(decl_type, name), " : ",
			          semantic, ";");

			// Structs and arrays should consume more locations.
			uint32_t consumed_locations = type_to_consumed_locations(decl_type);
			for (uint32_t i = 0; i < consumed_locations; i++)
				active_locations.insert(location_number + i);
		}
	}
	else
	{
		statement(variable_decl(type, name), " : ", binding, ";");
	}
}